

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O0

void dlist_destroy(dlist_head_t *head,_func_void_void_ptr *free)

{
  dlist_s *pdVar1;
  dlist_t *local_28;
  dlist_t *next;
  dlist_t *dlist;
  _func_void_void_ptr *free_local;
  dlist_head_t *head_local;
  
  if (head == (dlist_head_t *)0x0) {
    __assert_fail("head != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x46,
                  "void dlist_destroy(dlist_head_t *, void (*)(void *))");
  }
  head->num = 0;
  head->end = (dlist_s *)0x0;
  local_28 = head->dlist;
  if (local_28 != (dlist_s *)0x0) {
    while (local_28 != (dlist_t *)0x0) {
      pdVar1 = local_28->next;
      dlist_delete(local_28,free);
      local_28 = pdVar1;
    }
  }
  return;
}

Assistant:

void dlist_destroy(dlist_head_t *head,
                   void (*free)(void *data)) {
  assert(head != NULL);
  
  dlist_t *dlist, *next;
  
  head->num = 0;
  head->end = NULL;
  
  if (!(next = head->dlist))
    return;
  
  while (next) {
    dlist = next;
    next = dlist->next;
    dlist_delete(dlist, free);
  }
}